

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

_Bool cert_expr_match_str(char *expression,char *hostname,uint port)

{
  ExprNode *en_00;
  ptrlen expr;
  _Bool matched;
  ExprNode *en;
  uint port_local;
  char *hostname_local;
  char *expression_local;
  
  expr = ptrlen_from_asciz(expression);
  en_00 = parse(expr,(char **)0x0,(ptrlen *)0x0);
  if (en_00 == (ExprNode *)0x0) {
    expression_local._7_1_ = false;
  }
  else {
    expression_local._7_1_ = eval(en_00,hostname,port);
    exprnode_free(en_00);
  }
  return expression_local._7_1_;
}

Assistant:

bool cert_expr_match_str(const char *expression,
                         const char *hostname, unsigned port)
{
    ExprNode *en = parse(ptrlen_from_asciz(expression), NULL, NULL);
    if (!en)
        return false;

    bool matched = eval(en, hostname, port);
    exprnode_free(en);
    return matched;
}